

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O3

void FileWatcherRemoveWatch(HFileWatcher handle,char *watch)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  char *local_18;
  
  __mutex = (pthread_mutex_t *)((long)handle + 0x38);
  local_18 = watch;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    std::
    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
              (*(undefined8 *)((long)handle + 0x10),*(undefined8 *)((long)handle + 0x18),&local_18);
    lVar3 = *(long *)((long)handle + 0x18);
    if (0x20 < (ulong)(lVar3 - *(long *)((long)handle + 0x10))) {
      std::__cxx11::string::swap((string *)(lVar3 + -0x20));
      lVar3 = *(long *)((long)handle + 0x18);
    }
    *(long *)((long)handle + 0x18) = lVar3 + -0x20;
    if (*(long **)(lVar3 + -0x20) != (long *)(lVar3 + -0x10)) {
      operator_delete(*(long **)(lVar3 + -0x20),*(long *)(lVar3 + -0x10) + 1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void FileWatcherRemoveWatch(HFileWatcher handle, const char* watch) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    auto it = std::find(watcher->Watches.begin(), watcher->Watches.end(), watch);
    if (watcher->Watches.size() > 1) {
        std::swap(watcher->Watches.back(), *it);
    }
    watcher->Watches.pop_back();
}